

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O2

int skiwi::is_number(int *is_real,int *is_scientific,char *value)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  
  cVar1 = *value;
  lVar3 = 0;
  if (cVar1 != '\0') {
    if (cVar1 != '+') {
      if (cVar1 == 'e') {
        return 0;
      }
      if (cVar1 == 'E') {
        return 0;
      }
      if (cVar1 != '-') goto LAB_00256af7;
    }
    if (value[1] != '\0') {
      lVar3 = 1;
LAB_00256af7:
      *is_real = 0;
      *is_scientific = 0;
      pbVar4 = (byte *)(value + lVar3);
      do {
        bVar2 = *pbVar4;
        if (bVar2 == 0) {
          return 1;
        }
        if (bVar2 - 0x3a < 0xfffffff6) {
          if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
            if (*is_scientific != 0) {
              return 0;
            }
            *is_scientific = 1;
            *is_real = 1;
            bVar2 = pbVar4[1];
            if ((bVar2 == 0x2b) || (bVar2 == 0x2d)) {
              bVar2 = pbVar4[2];
              pbVar4 = pbVar4 + 1;
            }
            else if (bVar2 == 0) {
              return (uint)bVar2;
            }
            if (bVar2 == 0) {
              return 0;
            }
          }
          else {
            if (bVar2 != 0x2e) {
              return 0;
            }
            if (*is_real != 0) {
              return 0;
            }
            if (*is_scientific != 0) {
              return 0;
            }
            *is_real = 1;
          }
        }
        pbVar4 = pbVar4 + 1;
      } while( true );
    }
  }
  return 0;
}

Assistant:

int is_number(int* is_real, int* is_scientific, const char* value)
  {
  if (value[0] == '\0')
    return 0;
  int i = 0;
  if (value[0] == 'e' || value[0] == 'E')
    return 0;
  if (value[0] == '-' || value[0] == '+')
    {
    ++i;
    if (value[1] == '\0')
      return 0;
    }
  *is_real = 0;
  *is_scientific = 0;
  const char* s = value + i;
  while (*s != '\0')
    {
    if (isdigit((unsigned char)(*s)) == 0)
      {
      if ((*s == '.') && (*is_real == 0) && (*is_scientific == 0))
        *is_real = 1;
      else if ((*s == 'e' || *s == 'E') && (*is_scientific == 0))
        {
        *is_scientific = 1;
        *is_real = 1;
        if (*(s + 1) == '\0')
          return 0;
        if (*(s + 1) == '-' || *(s + 1) == '+')
          {
          ++s;
          }
        if (*(s + 1) == '\0')
          return 0;
        }
      else
        return 0;
      }
    ++s;
    }
  return 1;
  }